

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void highbd_dr_prediction_z1_16xN_avx2
               (int N,uint16_t *dst,ptrdiff_t stride,uint16_t *above,int upsample_above,int dx,
               int bd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  ushort uVar21;
  uint uVar22;
  long in_RCX;
  long lVar23;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  uint in_R9D;
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  int in_stack_00000008;
  int i_2;
  __m256i dstvec [64];
  __m256i shift;
  int i;
  int base;
  __m256i res;
  __m256i b;
  int r;
  int x;
  __m256i mask256;
  __m256i base_inc256;
  __m256i max_base_x256;
  __m256i diff;
  __m256i a_mbase_x;
  __m256i c3f;
  __m256i a16;
  __m256i a32;
  __m256i a1;
  __m256i a0;
  int max_base_x;
  int frac_bits;
  int mdif;
  __m256i shift_1;
  int i_1;
  int base_1;
  __m256i res1;
  __m256i res_1 [2];
  __m256i b_1;
  int r_1;
  int x_1;
  __m256i mask256_1;
  __m256i base_inc256_1;
  __m256i max_base_x256_1;
  __m256i diff_1;
  __m256i a_mbase_x_1;
  __m256i a16_1;
  __m256i a32_1;
  __m256i a1_1;
  __m256i a1_2;
  __m256i a0_1;
  __m256i a0_2;
  int max_base_x_1;
  int frac_bits_1;
  int local_1904;
  undefined8 local_1900 [264];
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 *local_1088;
  undefined1 local_1080 [32];
  int local_1048;
  int local_1044;
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  int local_fe8;
  uint local_fe4;
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined1 local_f80 [32];
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined1 local_f40 [16];
  undefined1 auStack_f30 [16];
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined1 local_f00 [32];
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  uint local_e88;
  undefined4 local_e84;
  undefined8 *local_e70;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  ushort local_dda;
  undefined2 local_dd8;
  ushort local_dd6;
  ushort local_dd4;
  undefined2 local_dd2;
  undefined1 (*local_dd0) [32];
  undefined1 (*local_dc8) [32];
  undefined1 local_dc0 [16];
  undefined1 auStack_db0 [16];
  undefined2 local_da0;
  undefined2 local_d9e;
  undefined2 local_d9c;
  undefined2 local_d9a;
  undefined2 local_d98;
  undefined2 local_d96;
  undefined2 local_d94;
  undefined2 local_d92;
  undefined2 local_d90;
  undefined2 local_d8e;
  undefined2 local_d8c;
  undefined2 local_d8a;
  undefined2 local_d88;
  undefined2 local_d86;
  undefined2 local_d84;
  undefined2 local_d82;
  undefined1 local_d80 [16];
  undefined1 auStack_d70 [16];
  ushort local_d60;
  ushort local_d5e;
  ushort local_d5c;
  ushort local_d5a;
  ushort local_d58;
  ushort local_d56;
  ushort local_d54;
  ushort local_d52;
  ushort local_d50;
  ushort local_d4e;
  ushort local_d4c;
  ushort local_d4a;
  ushort local_d48;
  ushort local_d46;
  ushort local_d44;
  ushort local_d42;
  undefined1 local_d40 [16];
  undefined1 auStack_d30 [16];
  ushort local_d20;
  ushort local_d1e;
  ushort local_d1c;
  ushort local_d1a;
  ushort local_d18;
  ushort local_d16;
  ushort local_d14;
  ushort local_d12;
  ushort local_d10;
  ushort local_d0e;
  ushort local_d0c;
  ushort local_d0a;
  ushort local_d08;
  ushort local_d06;
  ushort local_d04;
  ushort local_d02;
  undefined1 local_d00 [32];
  undefined2 local_ce0;
  undefined2 local_cde;
  undefined2 local_cdc;
  undefined2 local_cda;
  undefined2 local_cd8;
  undefined2 local_cd6;
  undefined2 local_cd4;
  undefined2 local_cd2;
  undefined2 local_cd0;
  undefined2 local_cce;
  undefined2 local_ccc;
  undefined2 local_cca;
  undefined2 local_cc8;
  undefined2 local_cc6;
  undefined2 local_cc4;
  undefined2 local_cc2;
  undefined1 local_cc0 [16];
  undefined1 auStack_cb0 [16];
  ushort local_ca0;
  ushort local_c9e;
  ushort local_c9c;
  ushort local_c9a;
  ushort local_c98;
  ushort local_c96;
  ushort local_c94;
  ushort local_c92;
  ushort local_c90;
  ushort local_c8e;
  ushort local_c8c;
  ushort local_c8a;
  ushort local_c88;
  ushort local_c86;
  ushort local_c84;
  ushort local_c82;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined1 local_c00 [16];
  undefined1 auStack_bf0 [16];
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined4 local_ba4;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined4 local_b64;
  undefined1 local_b60 [32];
  undefined4 local_b24;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  ushort local_ac0;
  ushort local_abe;
  ushort local_abc;
  ushort local_aba;
  ushort local_ab8;
  ushort local_ab6;
  ushort local_ab4;
  ushort local_ab2;
  ushort local_ab0;
  ushort local_aae;
  ushort local_aac;
  ushort local_aaa;
  ushort local_aa8;
  ushort local_aa6;
  ushort local_aa4;
  ushort local_aa2;
  undefined1 local_aa0 [16];
  undefined1 auStack_a90 [16];
  ushort local_a80;
  ushort local_a7e;
  ushort local_a7c;
  ushort local_a7a;
  ushort local_a78;
  ushort local_a76;
  ushort local_a74;
  ushort local_a72;
  ushort local_a70;
  ushort local_a6e;
  ushort local_a6c;
  ushort local_a6a;
  ushort local_a68;
  ushort local_a66;
  ushort local_a64;
  ushort local_a62;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  int local_9e4;
  undefined1 local_9e0 [32];
  int local_9a8;
  int local_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  int local_908;
  uint local_904;
  undefined1 local_900 [32];
  ushort local_788;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 uStack_170;
  undefined8 uStack_168;
  
  if (in_stack_00000008 < 0xc) {
    local_e70 = local_1900;
    local_e84 = 6;
    uVar22 = in_EDI + 0xf;
    local_e88 = uVar22;
    local_dd2 = 0x10;
    local_d82 = 0x10;
    local_d84 = 0x10;
    local_d86 = 0x10;
    local_d88 = 0x10;
    local_d8a = 0x10;
    local_d8c = 0x10;
    local_d8e = 0x10;
    local_d90 = 0x10;
    local_d92 = 0x10;
    local_d94 = 0x10;
    local_d96 = 0x10;
    local_d98 = 0x10;
    local_d9a = 0x10;
    local_d9c = 0x10;
    local_d9e = 0x10;
    local_da0 = 0x10;
    auVar3 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
    auVar3 = vpinsrw_avx(auVar3,0x10,2);
    auVar3 = vpinsrw_avx(auVar3,0x10,3);
    auVar3 = vpinsrw_avx(auVar3,0x10,4);
    auVar3 = vpinsrw_avx(auVar3,0x10,5);
    auVar3 = vpinsrw_avx(auVar3,0x10,6);
    auVar3 = vpinsrw_avx(auVar3,0x10,7);
    auVar4 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
    auVar4 = vpinsrw_avx(auVar4,0x10,2);
    auVar4 = vpinsrw_avx(auVar4,0x10,3);
    auVar4 = vpinsrw_avx(auVar4,0x10,4);
    auVar4 = vpinsrw_avx(auVar4,0x10,5);
    auVar4 = vpinsrw_avx(auVar4,0x10,6);
    auStack_db0 = vpinsrw_avx(auVar4,0x10,7);
    local_dc0 = auVar3;
    local_dc0._0_8_ = auVar3._0_8_;
    local_dc0._8_8_ = auVar3._8_8_;
    local_f20 = local_dc0._0_8_;
    uStack_f18 = local_dc0._8_8_;
    uStack_f10 = auStack_db0._0_8_;
    uStack_f08 = auStack_db0._8_8_;
    local_dd4 = *(ushort *)(in_RCX + (long)(int)uVar22 * 2);
    local_d42 = local_dd4;
    local_d44 = local_dd4;
    local_d46 = local_dd4;
    local_d48 = local_dd4;
    local_d4a = local_dd4;
    local_d4c = local_dd4;
    local_d4e = local_dd4;
    local_d50 = local_dd4;
    local_d52 = local_dd4;
    local_d54 = local_dd4;
    local_d56 = local_dd4;
    local_d58 = local_dd4;
    local_d5a = local_dd4;
    local_d5c = local_dd4;
    local_d5e = local_dd4;
    local_d60 = local_dd4;
    auVar4 = vpinsrw_avx(ZEXT216(local_dd4),(uint)local_dd4,1);
    auVar4 = vpinsrw_avx(auVar4,(uint)local_dd4,2);
    auVar4 = vpinsrw_avx(auVar4,(uint)local_dd4,3);
    auVar4 = vpinsrw_avx(auVar4,(uint)local_dd4,4);
    auVar4 = vpinsrw_avx(auVar4,(uint)local_dd4,5);
    auVar4 = vpinsrw_avx(auVar4,(uint)local_dd4,6);
    auVar4 = vpinsrw_avx(auVar4,(uint)local_dd4,7);
    auVar5 = vpinsrw_avx(ZEXT216(local_dd4),(uint)local_dd4,1);
    auVar5 = vpinsrw_avx(auVar5,(uint)local_dd4,2);
    auVar5 = vpinsrw_avx(auVar5,(uint)local_dd4,3);
    auVar5 = vpinsrw_avx(auVar5,(uint)local_dd4,4);
    auVar5 = vpinsrw_avx(auVar5,(uint)local_dd4,5);
    auVar5 = vpinsrw_avx(auVar5,(uint)local_dd4,6);
    auStack_d70 = vpinsrw_avx(auVar5,(uint)local_dd4,7);
    local_d80 = auVar4;
    local_d80._0_8_ = auVar4._0_8_;
    local_d80._8_8_ = auVar4._8_8_;
    local_f60 = local_d80._0_8_;
    uStack_f58 = local_d80._8_8_;
    uStack_f50 = auStack_d70._0_8_;
    uStack_f48 = auStack_d70._8_8_;
    local_e88._0_2_ = (ushort)uVar22;
    local_dd6 = (ushort)local_e88;
    local_d02 = (ushort)local_e88;
    local_d04 = (ushort)local_e88;
    local_d06 = (ushort)local_e88;
    local_d08 = (ushort)local_e88;
    local_d0a = (ushort)local_e88;
    local_d0c = (ushort)local_e88;
    local_d0e = (ushort)local_e88;
    local_d10 = (ushort)local_e88;
    local_d12 = (ushort)local_e88;
    local_d14 = (ushort)local_e88;
    local_d16 = (ushort)local_e88;
    local_d18 = (ushort)local_e88;
    local_d1a = (ushort)local_e88;
    local_d1c = (ushort)local_e88;
    local_d1e = (ushort)local_e88;
    local_d20 = (ushort)local_e88;
    auVar5 = vpinsrw_avx(ZEXT216((ushort)local_e88),uVar22 & 0xffff,1);
    auVar5 = vpinsrw_avx(auVar5,uVar22 & 0xffff,2);
    auVar5 = vpinsrw_avx(auVar5,uVar22 & 0xffff,3);
    auVar5 = vpinsrw_avx(auVar5,uVar22 & 0xffff,4);
    auVar5 = vpinsrw_avx(auVar5,uVar22 & 0xffff,5);
    auVar5 = vpinsrw_avx(auVar5,uVar22 & 0xffff,6);
    auVar5 = vpinsrw_avx(auVar5,uVar22 & 0xffff,7);
    auVar6 = vpinsrw_avx(ZEXT216((ushort)local_e88),uVar22 & 0xffff,1);
    auVar6 = vpinsrw_avx(auVar6,uVar22 & 0xffff,2);
    auVar6 = vpinsrw_avx(auVar6,uVar22 & 0xffff,3);
    auVar6 = vpinsrw_avx(auVar6,uVar22 & 0xffff,4);
    auVar6 = vpinsrw_avx(auVar6,uVar22 & 0xffff,5);
    auVar6 = vpinsrw_avx(auVar6,uVar22 & 0xffff,6);
    auStack_d30 = vpinsrw_avx(auVar6,uVar22 & 0xffff,7);
    local_d40 = auVar5;
    local_d40._0_8_ = auVar5._0_8_;
    local_d40._8_8_ = auVar5._8_8_;
    local_fa0 = local_d40._0_8_;
    uStack_f98 = local_d40._8_8_;
    uStack_f90 = auStack_d30._0_8_;
    uStack_f88 = auStack_d30._8_8_;
    local_dd8 = 0x3f;
    local_cc2 = 0x3f;
    local_cc4 = 0x3f;
    local_cc6 = 0x3f;
    local_cc8 = 0x3f;
    local_cca = 0x3f;
    local_ccc = 0x3f;
    local_cce = 0x3f;
    local_cd0 = 0x3f;
    local_cd2 = 0x3f;
    local_cd4 = 0x3f;
    local_cd6 = 0x3f;
    local_cd8 = 0x3f;
    local_cda = 0x3f;
    local_cdc = 0x3f;
    local_cde = 0x3f;
    local_ce0 = 0x3f;
    auVar6 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar6 = vpinsrw_avx(auVar6,0x3f,2);
    auVar6 = vpinsrw_avx(auVar6,0x3f,3);
    auVar6 = vpinsrw_avx(auVar6,0x3f,4);
    auVar6 = vpinsrw_avx(auVar6,0x3f,5);
    auVar6 = vpinsrw_avx(auVar6,0x3f,6);
    auVar6 = vpinsrw_avx(auVar6,0x3f,7);
    auVar25 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar25 = vpinsrw_avx(auVar25,0x3f,2);
    auVar25 = vpinsrw_avx(auVar25,0x3f,3);
    auVar25 = vpinsrw_avx(auVar25,0x3f,4);
    auVar25 = vpinsrw_avx(auVar25,0x3f,5);
    auVar25 = vpinsrw_avx(auVar25,0x3f,6);
    auVar25 = vpinsrw_avx(auVar25,0x3f,7);
    auVar24._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar25;
    auVar24._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar6;
    local_d00 = auVar24;
    local_d00._16_8_ = auVar24._16_8_;
    local_d00._24_8_ = auVar24._24_8_;
    local_f40 = auVar24._0_16_;
    auStack_f30 = auVar24._16_16_;
    local_fe4 = in_R9D;
    for (local_fe8 = 0; local_fe8 < in_EDI; local_fe8 = local_fe8 + 1) {
      local_1044 = (int)local_fe4 >> 6;
      if ((int)uVar22 <= local_1044) {
        for (local_1048 = local_fe8; local_1048 < in_EDI; local_1048 = local_1048 + 1) {
          lVar23 = (long)local_1048;
          local_1900[lVar23 * 4] = local_d80._0_8_;
          local_1900[lVar23 * 4 + 1] = local_d80._8_8_;
          local_1900[lVar23 * 4 + 2] = auStack_d70._0_8_;
          local_1900[lVar23 * 4 + 3] = auStack_d70._8_8_;
        }
        break;
      }
      local_dda = (ushort)local_fe4;
      local_c82 = (ushort)local_fe4;
      local_c84 = (ushort)local_fe4;
      local_c86 = (ushort)local_fe4;
      local_c88 = (ushort)local_fe4;
      local_c8a = (ushort)local_fe4;
      local_c8c = (ushort)local_fe4;
      local_c8e = (ushort)local_fe4;
      local_c90 = (ushort)local_fe4;
      local_c92 = (ushort)local_fe4;
      local_c94 = (ushort)local_fe4;
      local_c96 = (ushort)local_fe4;
      local_c98 = (ushort)local_fe4;
      local_c9a = (ushort)local_fe4;
      local_c9c = (ushort)local_fe4;
      local_c9e = (ushort)local_fe4;
      local_ca0 = (ushort)local_fe4;
      auVar6 = vpinsrw_avx(ZEXT216((ushort)local_fe4),local_fe4 & 0xffff,1);
      auVar6 = vpinsrw_avx(auVar6,local_fe4 & 0xffff,2);
      auVar6 = vpinsrw_avx(auVar6,local_fe4 & 0xffff,3);
      auVar6 = vpinsrw_avx(auVar6,local_fe4 & 0xffff,4);
      auVar6 = vpinsrw_avx(auVar6,local_fe4 & 0xffff,5);
      auVar6 = vpinsrw_avx(auVar6,local_fe4 & 0xffff,6);
      local_cc0 = vpinsrw_avx(auVar6,local_fe4 & 0xffff,7);
      auVar6 = vpinsrw_avx(ZEXT216((ushort)local_fe4),local_fe4 & 0xffff,1);
      auVar6 = vpinsrw_avx(auVar6,local_fe4 & 0xffff,2);
      auVar6 = vpinsrw_avx(auVar6,local_fe4 & 0xffff,3);
      auVar6 = vpinsrw_avx(auVar6,local_fe4 & 0xffff,4);
      auVar6 = vpinsrw_avx(auVar6,local_fe4 & 0xffff,5);
      auVar6 = vpinsrw_avx(auVar6,local_fe4 & 0xffff,6);
      auStack_cb0 = vpinsrw_avx(auVar6,local_fe4 & 0xffff,7);
      local_be0 = local_cc0._0_8_;
      uStack_bd8 = local_cc0._8_8_;
      uStack_bd0 = auStack_cb0._0_8_;
      uStack_bc8 = auStack_cb0._8_8_;
      local_c00 = auVar24._0_16_;
      auStack_bf0 = auVar24._16_16_;
      auVar13._16_8_ = auStack_cb0._0_8_;
      auVar13._0_16_ = local_cc0;
      auVar13._24_8_ = auStack_cb0._8_8_;
      auVar12._16_8_ = local_d00._16_8_;
      auVar12._0_16_ = auVar24._0_16_;
      auVar12._24_8_ = local_d00._24_8_;
      local_b60 = vpand_avx2(auVar13,auVar12);
      local_b64 = 1;
      local_1080 = vpsrlw_avx2(local_b60,ZEXT416(1));
      local_dc8 = (undefined1 (*) [32])(in_RCX + (long)local_1044 * 2);
      local_ec0 = *(undefined8 *)*local_dc8;
      uStack_eb8 = *(undefined8 *)(*local_dc8 + 8);
      uStack_eb0 = *(undefined8 *)(*local_dc8 + 0x10);
      uStack_ea8 = *(undefined8 *)(*local_dc8 + 0x18);
      local_dd0 = (undefined1 (*) [32])(in_RCX + 2 + (long)local_1044 * 2);
      local_ee0 = *(undefined8 *)*local_dd0;
      uStack_ed8 = *(undefined8 *)(*local_dd0 + 8);
      uStack_ed0 = *(undefined8 *)(*local_dd0 + 0x10);
      uStack_ec8 = *(undefined8 *)(*local_dd0 + 0x18);
      local_c60 = *(undefined8 *)*local_dd0;
      uStack_c58 = *(undefined8 *)(*local_dd0 + 8);
      uStack_c50 = *(undefined8 *)(*local_dd0 + 0x10);
      uStack_c48 = *(undefined8 *)(*local_dd0 + 0x18);
      local_c80 = local_ec0;
      uStack_c78 = uStack_eb8;
      uStack_c70 = uStack_eb0;
      uStack_c68 = uStack_ea8;
      local_f80 = vpsubw_avx2(*local_dd0,*local_dc8);
      local_b20 = local_ec0;
      uStack_b18 = uStack_eb8;
      uStack_b10 = uStack_eb0;
      uStack_b08 = uStack_ea8;
      local_b24 = 5;
      auVar8 = vpsllw_avx2(*local_dc8,ZEXT416(5));
      local_f00._0_8_ = auVar8._0_8_;
      local_f00._8_8_ = auVar8._8_8_;
      local_f00._16_8_ = auVar8._16_8_;
      local_f00._24_8_ = auVar8._24_8_;
      local_e00 = local_f00._0_8_;
      uStack_df8 = local_f00._8_8_;
      uStack_df0 = local_f00._16_8_;
      uStack_de8 = local_f00._24_8_;
      local_e20 = local_dc0._0_8_;
      uStack_e18 = local_dc0._8_8_;
      uStack_e10 = auStack_db0._0_8_;
      uStack_e08 = auStack_db0._8_8_;
      auVar9._16_8_ = auStack_db0._0_8_;
      auVar9._0_16_ = auVar3;
      auVar9._24_8_ = auStack_db0._8_8_;
      local_f00 = vpaddw_avx2(auVar8,auVar9);
      local_ae0 = local_f80._0_8_;
      uStack_ad8 = local_f80._8_8_;
      uStack_ad0 = local_f80._16_8_;
      uStack_ac8 = local_f80._24_8_;
      local_b00 = local_1080._0_8_;
      uStack_af8 = local_1080._8_8_;
      uStack_af0 = local_1080._16_8_;
      uStack_ae8 = local_1080._24_8_;
      local_1020 = vpmullw_avx2(local_f80,local_1080);
      local_e40 = local_f00._0_8_;
      uStack_e38 = local_f00._8_8_;
      uStack_e30 = local_f00._16_8_;
      uStack_e28 = local_f00._24_8_;
      local_e60 = local_1020._0_8_;
      uStack_e58 = local_1020._8_8_;
      uStack_e50 = local_1020._16_8_;
      uStack_e48 = local_1020._24_8_;
      auVar8 = vpaddw_avx2(local_f00,local_1020);
      local_1040._0_8_ = auVar8._0_8_;
      local_1040._8_8_ = auVar8._8_8_;
      local_1040._16_8_ = auVar8._16_8_;
      local_1040._24_8_ = auVar8._24_8_;
      local_ba0 = local_1040._0_8_;
      uStack_b98 = local_1040._8_8_;
      uStack_b90 = local_1040._16_8_;
      uStack_b88 = local_1040._24_8_;
      local_ba4 = 5;
      local_1040 = vpsrlw_avx2(auVar8,ZEXT416(5));
      local_aa2 = (ushort)local_1044;
      local_aa4 = local_aa2 + 1;
      local_aa6 = local_aa2 + 2;
      local_aa8 = local_aa2 + 3;
      local_aaa = local_aa2 + 4;
      local_aac = local_aa2 + 5;
      local_aae = local_aa2 + 6;
      local_ab0 = local_aa2 + 7;
      local_ab2 = local_aa2 + 8;
      local_ab4 = local_aa2 + 9;
      local_ab6 = local_aa2 + 10;
      local_ab8 = local_aa2 + 0xb;
      local_aba = local_aa2 + 0xc;
      local_abc = local_aa2 + 0xd;
      local_abe = local_aa2 + 0xe;
      local_ac0 = local_aa2 + 0xf;
      local_a62 = local_ac0;
      local_a64 = local_abe;
      local_a66 = local_abc;
      local_a68 = local_aba;
      local_a6a = local_ab8;
      local_a6c = local_ab6;
      local_a6e = local_ab4;
      local_a70 = local_ab2;
      local_a72 = local_ab0;
      local_a74 = local_aae;
      local_a76 = local_aac;
      local_a78 = local_aaa;
      local_a7a = local_aa8;
      local_a7c = local_aa6;
      local_a7e = local_aa4;
      local_a80 = local_aa2;
      auVar6 = vpinsrw_avx(ZEXT216(local_aa2),(uint)local_aa4,1);
      auVar6 = vpinsrw_avx(auVar6,(uint)local_aa6,2);
      auVar6 = vpinsrw_avx(auVar6,(uint)local_aa8,3);
      auVar6 = vpinsrw_avx(auVar6,(uint)local_aaa,4);
      auVar6 = vpinsrw_avx(auVar6,(uint)local_aac,5);
      auVar6 = vpinsrw_avx(auVar6,(uint)local_aae,6);
      local_aa0 = vpinsrw_avx(auVar6,(uint)local_ab0,7);
      auVar6 = vpinsrw_avx(ZEXT216(local_ab2),(uint)local_ab4,1);
      auVar6 = vpinsrw_avx(auVar6,(uint)local_ab6,2);
      auVar6 = vpinsrw_avx(auVar6,(uint)local_ab8,3);
      auVar6 = vpinsrw_avx(auVar6,(uint)local_aba,4);
      auVar6 = vpinsrw_avx(auVar6,(uint)local_abc,5);
      auVar6 = vpinsrw_avx(auVar6,(uint)local_abe,6);
      auStack_a90 = vpinsrw_avx(auVar6,(uint)local_ac0,7);
      local_fc0 = local_aa0._0_8_;
      uStack_fb8 = local_aa0._8_8_;
      uStack_fb0 = auStack_a90._0_8_;
      uStack_fa8 = auStack_a90._8_8_;
      local_c20 = local_d40._0_8_;
      uStack_c18 = local_d40._8_8_;
      uStack_c10 = auStack_d30._0_8_;
      uStack_c08 = auStack_d30._8_8_;
      local_c40 = local_aa0._0_8_;
      uStack_c38 = local_aa0._8_8_;
      uStack_c30 = auStack_a90._0_8_;
      uStack_c28 = auStack_a90._8_8_;
      auVar11._16_8_ = auStack_d30._0_8_;
      auVar11._0_16_ = auVar5;
      auVar11._24_8_ = auStack_d30._8_8_;
      auVar10._16_8_ = auStack_a90._0_8_;
      auVar10._0_16_ = local_aa0;
      auVar10._24_8_ = auStack_a90._8_8_;
      local_fe0 = vpcmpgtw_avx2(auVar11,auVar10);
      local_a20 = local_d80._0_8_;
      uStack_a18 = local_d80._8_8_;
      uStack_a10 = auStack_d70._0_8_;
      uStack_a08 = auStack_d70._8_8_;
      local_a40 = local_1040._0_8_;
      uStack_a38 = local_1040._8_8_;
      uStack_a30 = local_1040._16_8_;
      uStack_a28 = local_1040._24_8_;
      local_a60 = local_fe0._0_8_;
      uStack_a58 = local_fe0._8_8_;
      uStack_a50 = local_fe0._16_8_;
      uStack_a48 = local_fe0._24_8_;
      auVar14._16_8_ = auStack_d70._0_8_;
      auVar14._0_16_ = auVar4;
      auVar14._24_8_ = auStack_d70._8_8_;
      auVar8 = vpblendvb_avx2(auVar14,local_1040,local_fe0);
      *(undefined1 (*) [32])(local_1900 + (long)local_fe8 * 4) = auVar8;
      local_fe4 = in_R9D + local_fe4;
    }
  }
  else {
    uVar22 = in_EDI + 0xf;
    auVar3 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
    auVar3 = vpinsrd_avx(auVar3,0x10,2);
    auVar3 = vpinsrd_avx(auVar3,0x10,3);
    auVar4 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
    auVar4 = vpinsrd_avx(auVar4,0x10,2);
    auVar4 = vpinsrd_avx(auVar4,0x10,3);
    uStack_590 = auVar4._0_8_;
    uStack_588 = auVar4._8_8_;
    uVar21 = *(ushort *)(in_RCX + (long)(int)uVar22 * 2);
    auVar4 = vpinsrw_avx(ZEXT216(uVar21),(uint)uVar21,1);
    auVar4 = vpinsrw_avx(auVar4,(uint)uVar21,2);
    auVar4 = vpinsrw_avx(auVar4,(uint)uVar21,3);
    auVar4 = vpinsrw_avx(auVar4,(uint)uVar21,4);
    auVar4 = vpinsrw_avx(auVar4,(uint)uVar21,5);
    auVar4 = vpinsrw_avx(auVar4,(uint)uVar21,6);
    auVar4 = vpinsrw_avx(auVar4,(uint)uVar21,7);
    auVar5 = vpinsrw_avx(ZEXT216(uVar21),(uint)uVar21,1);
    auVar5 = vpinsrw_avx(auVar5,(uint)uVar21,2);
    auVar5 = vpinsrw_avx(auVar5,(uint)uVar21,3);
    auVar5 = vpinsrw_avx(auVar5,(uint)uVar21,4);
    auVar5 = vpinsrw_avx(auVar5,(uint)uVar21,5);
    auVar5 = vpinsrw_avx(auVar5,(uint)uVar21,6);
    auVar5 = vpinsrw_avx(auVar5,(uint)uVar21,7);
    local_720 = auVar4._0_8_;
    uStack_718 = auVar4._8_8_;
    uStack_710 = auVar5._0_8_;
    uStack_708 = auVar5._8_8_;
    local_788 = (ushort)uVar22;
    auVar5 = vpinsrw_avx(ZEXT216(local_788),uVar22 & 0xffff,1);
    auVar5 = vpinsrw_avx(auVar5,uVar22 & 0xffff,2);
    auVar5 = vpinsrw_avx(auVar5,uVar22 & 0xffff,3);
    auVar5 = vpinsrw_avx(auVar5,uVar22 & 0xffff,4);
    auVar5 = vpinsrw_avx(auVar5,uVar22 & 0xffff,5);
    auVar5 = vpinsrw_avx(auVar5,uVar22 & 0xffff,6);
    auVar5 = vpinsrw_avx(auVar5,uVar22 & 0xffff,7);
    auVar6 = vpinsrw_avx(ZEXT216(local_788),uVar22 & 0xffff,1);
    auVar6 = vpinsrw_avx(auVar6,uVar22 & 0xffff,2);
    auVar6 = vpinsrw_avx(auVar6,uVar22 & 0xffff,3);
    auVar6 = vpinsrw_avx(auVar6,uVar22 & 0xffff,4);
    auVar6 = vpinsrw_avx(auVar6,uVar22 & 0xffff,5);
    auVar6 = vpinsrw_avx(auVar6,uVar22 & 0xffff,6);
    auVar6 = vpinsrw_avx(auVar6,uVar22 & 0xffff,7);
    auVar25 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar5;
    uStack_6d0 = auVar25._0_8_;
    uStack_6c8 = auVar25._8_8_;
    local_904 = in_R9D;
    for (local_908 = 0; local_908 < in_EDI; local_908 = local_908 + 1) {
      local_9a4 = (int)local_904 >> 6;
      if ((int)uVar22 <= local_9a4) {
        for (local_9a8 = local_908; local_9a8 < in_EDI; local_9a8 = local_9a8 + 1) {
          lVar23 = (long)local_9a8;
          local_1900[lVar23 * 4] = local_720;
          local_1900[lVar23 * 4 + 1] = uStack_718;
          local_1900[lVar23 * 4 + 2] = uStack_710;
          local_1900[lVar23 * 4 + 3] = uStack_708;
        }
        break;
      }
      auVar25 = vpinsrd_avx(ZEXT416(local_904),local_904,1);
      auVar25 = vpinsrd_avx(auVar25,local_904,2);
      auVar25 = vpinsrd_avx(auVar25,local_904,3);
      auVar1 = vpinsrd_avx(ZEXT416(local_904),local_904,1);
      auVar1 = vpinsrd_avx(auVar1,local_904,2);
      auVar1 = vpinsrd_avx(auVar1,local_904,3);
      uStack_550 = auVar1._0_8_;
      uStack_548 = auVar1._8_8_;
      auVar1 = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
      auVar1 = vpinsrd_avx(auVar1,0x3f,2);
      auVar1 = vpinsrd_avx(auVar1,0x3f,3);
      auVar2 = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
      auVar2 = vpinsrd_avx(auVar2,0x3f,2);
      auVar2 = vpinsrd_avx(auVar2,0x3f,3);
      uStack_510 = auVar2._0_8_;
      uStack_508 = auVar2._8_8_;
      auVar7._16_8_ = uStack_550;
      auVar7._0_16_ = auVar25;
      auVar7._24_8_ = uStack_548;
      auVar8._16_8_ = uStack_510;
      auVar8._0_16_ = auVar1;
      auVar8._24_8_ = uStack_508;
      auVar8 = vpand_avx2(auVar7,auVar8);
      local_9e0 = vpsrld_avx2(auVar8,ZEXT416(1));
      auVar8 = vpmovzxwd_avx2(*(undefined1 (*) [16])(in_RCX + (long)local_9a4 * 2));
      auVar7 = vpmovzxwd_avx2(*(undefined1 (*) [16])(in_RCX + 2 + (long)local_9a4 * 2));
      auVar7 = vpsubd_avx2(auVar7,auVar8);
      auVar8 = vpslld_avx2(auVar8,ZEXT416(5));
      auVar18._16_8_ = uStack_590;
      auVar18._0_16_ = auVar3;
      auVar18._24_8_ = uStack_588;
      auVar8 = vpaddd_avx2(auVar8,auVar18);
      local_940 = vpmulld_avx2(auVar7,local_9e0);
      auVar8 = vpaddd_avx2(auVar8,local_940);
      auVar8 = vpsrld_avx2(auVar8,ZEXT416(5));
      local_980 = vpackusdw_avx2(auVar8,ZEXT1632(auVar8._16_16_));
      local_9e4 = uVar22 - local_9a4;
      if ((int)(uVar22 - local_9a4) < 9) {
        local_960._16_8_ = uStack_710;
        local_960._0_16_ = auVar4;
        local_960._24_8_ = uStack_708;
      }
      else {
        auVar8 = vpmovzxwd_avx2(*(undefined1 (*) [16])(in_RCX + 0x10 + (long)local_9a4 * 2));
        auVar7 = vpmovzxwd_avx2(*(undefined1 (*) [16])(in_RCX + 0x12 + (long)local_9a4 * 2));
        auVar7 = vpsubd_avx2(auVar7,auVar8);
        auVar8 = vpslld_avx2(auVar8,ZEXT416(5));
        auVar17._16_8_ = uStack_590;
        auVar17._0_16_ = auVar3;
        auVar17._24_8_ = uStack_588;
        auVar8 = vpaddd_avx2(auVar8,auVar17);
        local_940 = vpmulld_avx2(auVar7,local_9e0);
        auVar8 = vpaddd_avx2(auVar8,local_940);
        auVar8 = vpsrld_avx2(auVar8,ZEXT416(5));
        local_960 = vpackusdw_avx2(auVar8,ZEXT1632(auVar8._16_16_));
      }
      local_9a0._0_16_ = ZEXT116(0) * local_960._0_16_ + ZEXT116(1) * local_980._0_16_;
      local_9a0._16_16_ = ZEXT116(0) * local_980._16_16_ + ZEXT116(1) * local_960._0_16_;
      uVar21 = (ushort)local_9a4;
      auVar25 = vpinsrw_avx(ZEXT216(uVar21),(uint)(ushort)(uVar21 + 1),1);
      auVar25 = vpinsrw_avx(auVar25,(uint)(ushort)(uVar21 + 2),2);
      auVar25 = vpinsrw_avx(auVar25,(uint)(ushort)(uVar21 + 3),3);
      auVar25 = vpinsrw_avx(auVar25,(uint)(ushort)(uVar21 + 4),4);
      auVar25 = vpinsrw_avx(auVar25,(uint)(ushort)(uVar21 + 5),5);
      auVar25 = vpinsrw_avx(auVar25,(uint)(ushort)(uVar21 + 6),6);
      auVar25 = vpinsrw_avx(auVar25,(uint)(ushort)(uVar21 + 7),7);
      auVar1 = vpinsrw_avx(ZEXT216((ushort)(uVar21 + 8)),(uint)(ushort)(uVar21 + 9),1);
      auVar1 = vpinsrw_avx(auVar1,(uint)(ushort)(uVar21 + 10),2);
      auVar1 = vpinsrw_avx(auVar1,(uint)(ushort)(uVar21 + 0xb),3);
      auVar1 = vpinsrw_avx(auVar1,(uint)(ushort)(uVar21 + 0xc),4);
      auVar1 = vpinsrw_avx(auVar1,(uint)(ushort)(uVar21 + 0xd),5);
      auVar1 = vpinsrw_avx(auVar1,(uint)(ushort)(uVar21 + 0xe),6);
      auVar1 = vpinsrw_avx(auVar1,(uint)(ushort)(uVar21 + 0xf),7);
      uStack_170 = auVar1._0_8_;
      uStack_168 = auVar1._8_8_;
      auVar16._16_8_ = uStack_6d0;
      auVar16._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar6;
      auVar16._24_8_ = uStack_6c8;
      auVar15._16_8_ = uStack_170;
      auVar15._0_16_ = auVar25;
      auVar15._24_8_ = uStack_168;
      local_900 = vpcmpgtw_avx2(auVar16,auVar15);
      auVar20._16_8_ = uStack_710;
      auVar20._0_16_ = auVar4;
      auVar20._24_8_ = uStack_708;
      auVar19._16_8_ = local_9a0._16_8_;
      auVar19._0_16_ = local_9a0._0_16_;
      auVar19._24_8_ = local_9a0._24_8_;
      auVar8 = vpblendvb_avx2(auVar20,auVar19,local_900);
      *(undefined1 (*) [32])(local_1900 + (long)local_908 * 4) = auVar8;
      local_904 = in_R9D + local_904;
    }
  }
  for (local_1904 = 0; local_1904 < in_EDI; local_1904 = local_1904 + 1) {
    local_1088 = (undefined8 *)(in_RSI + in_RDX * local_1904 * 2);
    lVar23 = (long)local_1904;
    uStack_10b8 = local_1900[lVar23 * 4 + 1];
    uStack_10b0 = local_1900[lVar23 * 4 + 2];
    uStack_10a8 = local_1900[lVar23 * 4 + 3];
    local_10c0 = local_1900[lVar23 * 4];
    *local_1088 = local_1900[lVar23 * 4];
    local_1088[1] = uStack_10b8;
    local_1088[2] = uStack_10b0;
    local_1088[3] = uStack_10a8;
  }
  return;
}

Assistant:

static void highbd_dr_prediction_z1_16xN_avx2(int N, uint16_t *dst,
                                              ptrdiff_t stride,
                                              const uint16_t *above,
                                              int upsample_above, int dx,
                                              int bd) {
  __m256i dstvec[64];
  if (bd < 12) {
    highbd_dr_prediction_z1_16xN_internal_avx2(N, dstvec, above, upsample_above,
                                               dx);
  } else {
    highbd_dr_prediction_32bit_z1_16xN_internal_avx2(N, dstvec, above,
                                                     upsample_above, dx);
  }
  for (int i = 0; i < N; i++) {
    _mm256_storeu_si256((__m256i *)(dst + stride * i), dstvec[i]);
  }
}